

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O2

iter_type __thiscall
booster::locale::impl_posix::num_format<char>::do_format_currency
          (num_format<char> *this,bool intl,iter_type out,ios_base *param_3,char_type param_4,
          longdouble val)

{
  int *piVar1;
  size_t sVar2;
  streambuf_type *psVar3;
  uint uVar4;
  undefined7 in_register_00000031;
  char *__format;
  ostreambuf_iterator<char,_std::char_traits<char>_> oVar5;
  iter_type iVar6;
  ostreambuf_iterator<char,_std::char_traits<char>_> out_00;
  allocator_type local_5d;
  char buf [4];
  vector<char,_std::allocator<char>_> tmp;
  
  psVar3 = out._M_sbuf;
  uVar4 = out._8_4_;
  buf[0] = '\0';
  buf[1] = '\0';
  buf[2] = '\0';
  buf[3] = '\0';
  __format = "%n";
  if ((int)CONCAT71(in_register_00000031,intl) != 0) {
    __format = "%i";
  }
  piVar1 = __errno_location();
  *piVar1 = 0;
  sVar2 = strfmon_l(buf,4,(__locale_t)
                          *(this->lc_).
                           super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                    __format);
  if ((long)sVar2 < 0) {
    std::vector<char,_std::allocator<char>_>::vector(&tmp,8,&local_5d);
    while( true ) {
      if (0x1002 < (ulong)((long)tmp.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                 super__Vector_impl_data._M_finish -
                          (long)tmp.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_start)) break;
      sVar2 = strfmon_l(tmp.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)tmp.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                        (long)tmp.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_start,
                        (__locale_t)
                        *(this->lc_).
                         super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                        __format,(double)val);
      if (-1 < (long)sVar2) {
        oVar5._8_4_ = uVar4 & 0xff;
        oVar5._M_sbuf = psVar3;
        oVar5._12_4_ = 0;
        oVar5 = write_it(this,oVar5,
                         tmp.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start,sVar2);
        psVar3 = oVar5._M_sbuf;
        uVar4 = oVar5._8_4_;
        break;
      }
      std::vector<char,_std::allocator<char>_>::resize
                (&tmp,((long)tmp.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                      (long)tmp.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start) * 2);
    }
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
              (&tmp.super__Vector_base<char,_std::allocator<char>_>);
  }
  else {
    out_00._8_4_ = uVar4 & 0xff;
    out_00._M_sbuf = psVar3;
    out_00._12_4_ = 0;
    oVar5 = write_it(this,out_00,buf,sVar2);
    psVar3 = oVar5._M_sbuf;
    uVar4 = oVar5._8_4_;
  }
  iVar6._8_4_ = uVar4;
  iVar6._M_sbuf = psVar3;
  iVar6._12_4_ = 0;
  return iVar6;
}

Assistant:

virtual iter_type do_format_currency(bool intl,iter_type out,std::ios_base &/*ios*/,char_type /*fill*/,long double val) const
    {
        char buf[4]={};
        char const *format = intl ? "%i" : "%n";
        errno=0;
        ssize_t n = strfmon_l(buf,sizeof(buf),*lc_,format,static_cast<double>(val));
        if(n >= 0) 
            return write_it(out,buf,n);
        
        for(std::vector<char> tmp(sizeof(buf)*2);tmp.size() <= 4098;tmp.resize(tmp.size()*2)) {
            n = strfmon_l(&tmp.front(),tmp.size(),*lc_,format,static_cast<double>(val));
            if(n >= 0)
                return write_it(out,&tmp.front(),n);
        }
        return out;
    }